

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O3

aphy_error __thiscall
APhyBullet::BulletWorld::removeRigidBody(BulletWorld *this,collision_object_ref *object)

{
  _func_int **pp_Var1;
  __node_base_ptr p_Var2;
  aphy_error aVar3;
  
  pp_Var1 = object->counter->object[1].super_base_interface._vptr_base_interface;
  aVar3 = APHY_INVALID_PARAMETER;
  if ((pp_Var1 != (_func_int **)0x0) && (((ulong)pp_Var1[0x20] & 2) != 0)) {
    (*(this->handle->super_btCollisionWorld)._vptr_btCollisionWorld[0x17])();
    p_Var2 = std::
             _Hashtable<aphy::ref<aphy::collision_object>,_aphy::ref<aphy::collision_object>,_std::allocator<aphy::ref<aphy::collision_object>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::_M_find_before_node
                       (&(this->collisionObjects)._M_h,
                        (ulong)object->counter % (this->collisionObjects)._M_h._M_bucket_count,
                        object,(__hash_code)object->counter);
    aVar3 = APHY_OK;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (aVar3 = APHY_OK, (__node_type *)p_Var2->_M_nxt != (__node_type *)0x0)) {
      std::
      _Hashtable<aphy::ref<aphy::collision_object>,_aphy::ref<aphy::collision_object>,_std::allocator<aphy::ref<aphy::collision_object>_>,_std::__detail::_Identity,_std::equal_to<aphy::ref<aphy::collision_object>_>,_std::hash<aphy::ref<aphy::collision_object>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::erase(&(this->collisionObjects)._M_h,(const_iterator)p_Var2->_M_nxt);
    }
  }
  return aVar3;
}

Assistant:

aphy_error BulletWorld::removeRigidBody(const collision_object_ref &object)
{
    auto rigidBody = btRigidBody::upcast(object.as<BulletCollisionObject>()->handle);
    if(!rigidBody)
        return APHY_INVALID_PARAMETER;

    handle->removeRigidBody(rigidBody);

    auto it = collisionObjects.find(object);
    if(it != collisionObjects.end())
        collisionObjects.erase(it);

    return APHY_OK;
}